

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_alloc_addr(nng_stream_listener **lp,nng_sockaddr *sa)

{
  nng_stream_listener *pnVar1;
  tcp_listener *l;
  nng_sockaddr *sa_local;
  nng_stream_listener **lp_local;
  
  pnVar1 = (nng_stream_listener *)nni_zalloc(0x158);
  if (pnVar1 == (nng_stream_listener *)0x0) {
    lp_local._4_4_ = 2;
  }
  else {
    nni_mtx_init((nni_mtx *)&pnVar1[3].sl_set_tls);
    nni_aio_list_init((nni_list *)&pnVar1[3].sl_accept);
    *(undefined1 *)((long)&pnVar1[3].sl_get_tls + 1) = 0;
    *(undefined1 *)&pnVar1[3].sl_get_tls = 0;
    *(undefined1 *)((long)&pnVar1[3].sl_get_tls + 2) = 1;
    memcpy(pnVar1 + 1,sa,0x88);
    pnVar1->sl_free = tcp_listener_free;
    pnVar1->sl_close = tcp_listener_close;
    pnVar1->sl_stop = tcp_listener_stop;
    pnVar1->sl_listen = tcp_listener_listen;
    pnVar1->sl_accept = tcp_listener_accept;
    pnVar1->sl_get = tcp_listener_get;
    pnVar1->sl_set = tcp_listener_set;
    *lp = pnVar1;
    lp_local._4_4_ = 0;
  }
  return lp_local._4_4_;
}

Assistant:

static int
tcp_listener_alloc_addr(nng_stream_listener **lp, const nng_sockaddr *sa)
{
	tcp_listener *l;

	if ((l = NNI_ALLOC_STRUCT(l)) == NULL) {
		return (NNG_ENOMEM);
	}

	nni_mtx_init(&l->mtx);
	nni_aio_list_init(&l->acceptq);

	l->closed  = false;
	l->started = false;
	l->nodelay = true;
	l->sa      = *sa;

	l->ops.sl_free   = tcp_listener_free;
	l->ops.sl_close  = tcp_listener_close;
	l->ops.sl_stop   = tcp_listener_stop;
	l->ops.sl_listen = tcp_listener_listen;
	l->ops.sl_accept = tcp_listener_accept;
	l->ops.sl_get    = tcp_listener_get;
	l->ops.sl_set    = tcp_listener_set;

	*lp = (void *) l;
	return (0);
}